

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

uchar * __thiscall
CVmRun::do_call_func_nr(CVmRun *this,uint caller_ofs,pool_ofs_t target_ofs,uint argc)

{
  uchar *puVar1;
  ushort uVar2;
  char *pcVar3;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  vm_val_t *pvVar6;
  uchar *puVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  CVmFuncPtr local_38;
  
  r0_.typ = VM_NIL;
  pcVar3 = G_code_pool_X.super_CVmPoolPaged.pages_
           [target_ofs >> ((byte)G_code_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem;
  uVar9 = (ulong)(G_code_pool_X.super_CVmPoolPaged._8_4_ - 1 & target_ofs);
  puVar1 = (uchar *)(pcVar3 + uVar9);
  uVar2 = *(ushort *)(pcVar3 + uVar9 + 2);
  local_38.p_ = puVar1;
  iVar8 = CVmStack::check_space(&this->super_CVmStack,*(ushort *)(pcVar3 + uVar9 + 4) + 0xb);
  pvVar5 = sp_;
  if (iVar8 == 0) {
    err_throw(0x8ff);
  }
  pvVar4 = &sp_->typ;
  sp_ = sp_ + (ulong)uVar2 + 0xb;
  *pvVar4 = VM_PROP;
  (pvVar5->val).prop = 0;
  pvVar5[1].typ = VM_NIL;
  pvVar5[2].typ = VM_NIL;
  pvVar5[3].typ = VM_NIL;
  pvVar5[3].val.obj = 0;
  pvVar5[4].typ = VM_FUNCPTR;
  pvVar5[4].val.ofs = target_ofs;
  pvVar5[5].typ = VM_NIL;
  pvVar5[6].typ = VM_CODEPTR;
  pvVar5[6].val.ptr = (void *)0x0;
  pvVar5[7].typ = VM_CODEOFS;
  pvVar5[7].val.obj = caller_ofs;
  puVar7 = entry_ptr_native_;
  pvVar5[8].typ = VM_CODEPTR;
  pvVar5[8].val.ptr = puVar7;
  pvVar5[9].typ = VM_INT;
  pvVar5[9].val.obj = argc;
  pvVar6 = frame_ptr_;
  pvVar5[10].typ = VM_STACK;
  pvVar5[10].val.native_desc = (CVmNativeCodeDesc *)pvVar6;
  iVar8 = CVmFuncPtr::argc_ok(&local_38,argc);
  if (iVar8 != 0) {
    frame_ptr_ = pvVar5 + 0xb;
    entry_ptr_native_ = puVar1;
    for (lVar10 = 0; (uint)uVar2 << 4 != (int)lVar10; lVar10 = lVar10 + 0x10) {
      *(undefined4 *)((long)&pvVar5[0xb].typ + lVar10) = 1;
    }
    return puVar1 + this->funchdr_size_;
  }
  err_throw(0x899);
}

Assistant:

const uchar *CVmRun::do_call_func_nr(VMG_ uint caller_ofs,
                                     pool_ofs_t target_ofs, uint argc)
{
    const uchar *target_ofs_ptr;
    CVmFuncPtr hdr_ptr;
    uint i;
    vm_val_t *fp;
    int lcl_cnt;

    /* store nil in R0 */
    r0_.set_nil();

    /* translate the target address */
    target_ofs_ptr = (const uchar *)G_code_pool->get_ptr(target_ofs);

    /* set up a pointer to the new function header */
    hdr_ptr.set(target_ofs_ptr);

    /* get the number of locals from the header */
    lcl_cnt = hdr_ptr.get_local_cnt();

    /* get the target's stack space needs and check for stack overflow */
    if (!check_space(hdr_ptr.get_stack_depth() + 11))
        err_throw(VMERR_STACK_OVERFLOW);

    /* allocate the stack frame */
    fp = push(11 + lcl_cnt);

    /* there's no target property, target object, defining object, or self */
    (fp++)->set_propid(VM_INVALID_PROP);
    (fp++)->set_nil();
    (fp++)->set_nil();
    (fp++)->set_nil_obj();

    /* push the invokee */
    (fp++)->set_fnptr(target_ofs);

    /* push the frame reference slot */
    (fp++)->set_nil();

    /* push the native code descriptor (none for a non-recursive call) */
    (fp++)->set_codeptr(0);

    /* push the caller's code offset */
    (fp++)->set_codeofs(caller_ofs);

    /* push the current entrypoint code offset */
    (fp++)->set_codeptr(entry_ptr_native_);

    /* push the actual parameter count */
    (fp++)->set_int((int32_t)argc);

    /* push the current frame pointer */
    (fp++)->set_stack(frame_ptr_);

    /* verify the argument count */
    if (!hdr_ptr.argc_ok(argc))
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* set up the new stack frame */
    frame_ptr_ = fp;

    /* load EP with the new code offset */
    entry_ptr_native_ = target_ofs_ptr;

    /* push nil for each local */
    for (i = lcl_cnt ; i != 0 ; --i)
        (fp++)->set_nil();

    /* create and activate the new function's profiler frame */
    VM_IF_PROFILER(if (profiling_)
        prof_enter(vmg_ target_ofs_ptr));

    /* return the new program counter */
    return target_ofs_ptr + get_funchdr_size();
}